

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbtsub.c
# Opt level: O2

void ccfuncall(uint atom_index,int argnum,int bytenum)

{
  uint *puVar1;
  DLword *pDVar2;
  short sVar3;
  LispPTR LVar4;
  int iVar5;
  LispPTR *pLVar6;
  fnhead *pfVar7;
  int iVar8;
  
  LVar4 = LAddrFromNative(MachineState.csp);
  MachineState.pvar[-5] = (short)LVar4 + (short)argnum * -2 + 4;
  MachineState.ivar = (DLword *)((ulong)((uint)MachineState.pvar[-5] * 2) + (long)Stackspace);
  MachineState.pvar[-6] =
       ((short)MachineState.currentpc + (short)bytenum) - (short)MachineState.currentfunc;
  pLVar6 = (LispPTR *)(MachineState.csp + 2);
  MachineState.csp = MachineState.csp + 2;
  *pLVar6 = MachineState.tosvalue;
  if ((atom_index & 0xfff0000) == 0) {
    pLVar6 = (LispPTR *)(AtomSpace + (ulong)(atom_index * 5) * 2);
  }
  else {
    pLVar6 = NativeAligned4FromLAddr(atom_index);
  }
  pfVar7 = (fnhead *)NativeAligned4FromLAddr(pLVar6[2] & 0xfffffff);
  if ((MachineState.endofstack <= MachineState.csp + (ulong)pfVar7->stkmin + 0x20) &&
     (iVar5 = do_stackoverflow(1), iVar5 != 0)) {
    puVar1 = (uint *)(MachineState.csp + 2);
    MachineState.csp = MachineState.csp + 2;
    *puVar1 = argnum | 0xe0000;
    contextsw(2,(short)bytenum - 1,1);
    return;
  }
  MachineState.currentfunc = pfVar7;
  if (-1 < pfVar7->na) {
    iVar8 = argnum - pfVar7->na;
    for (iVar5 = iVar8; iVar5 < 0; iVar5 = iVar5 + 1) {
      pDVar2 = MachineState.csp;
      MachineState.csp = MachineState.csp + 2;
      pDVar2[2] = 0;
      pDVar2[3] = 0;
    }
    iVar5 = 0;
    if (0 < iVar8) {
      iVar5 = iVar8;
    }
    MachineState.csp = MachineState.csp + -(long)(iVar5 * 2);
  }
  MachineState.csp = MachineState.csp + 2;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0x8000;
  *(DLword *)((ulong)(MachineState.csp + 1) ^ 2) = MachineState.pvar[-5];
  MachineState.csp = MachineState.csp + 2;
  *(undefined2 *)((ulong)MachineState.csp ^ 2) = 0xc000;
  LVar4 = LAddrFromNative(MachineState.pvar);
  *MachineState.csp = (DLword)LVar4;
  MachineState.pvar = MachineState.csp + 10;
  *(LispPTR *)(MachineState.csp + 2) = pLVar6[2] & 0xfffffff;
  MachineState.csp = MachineState.pvar;
  for (sVar3 = (MachineState.currentfunc)->pv + 1; 0 < sVar3; sVar3 = sVar3 + -1) {
    pDVar2 = MachineState.csp + 1;
    MachineState.csp[0] = 0;
    *pDVar2 = 0xffff;
    pDVar2 = MachineState.csp;
    MachineState.csp = MachineState.csp + 2;
    pDVar2[2] = 0;
    pDVar2[3] = 0xffff;
    MachineState.csp = MachineState.csp + 2;
  }
  MachineState.currentpc =
       (ByteCode *)
       ((long)MachineState.currentfunc + ((ulong)(MachineState.currentfunc)->startpc - 3));
  return;
}

Assistant:

void ccfuncall(unsigned int atom_index, int argnum, int bytenum)
 /* Atomindex for Function you want to invoke */
 /* Number of ARGS on TOS and STK */
 /* Number of bytes of Caller's OPCODE(including multi-byte) */
{
  struct definition_cell *defcell68k; /* Definition Cell PTR */
  short pv_num;                       /* scratch for pv */
  struct fnhead *tmp_fn;
  int rest; /* use for alignments */

  /* Get Next Block offset from argnum */
  CURRENTFX->nextblock = (LAddrFromNative(CurrentStackPTR) & 0x0ffff) - (argnum << 1) + 4 /* +3  */;

  /* Setup IVar */ /* XXX: is it really only 2-byte aligned? */
  IVar = NativeAligned2FromStackOffset(CURRENTFX->nextblock);

  /* Set PC to the Next Instruction and save into FX */
  CURRENTFX->pc = ((UNSIGNED)PC - (UNSIGNED)FuncObj) + bytenum;

  PushCStack; /* save TOS */

  /* Get DEFCELL 68k address */
  defcell68k = (struct definition_cell *)GetDEFCELL68k(atom_index);

  tmp_fn = (struct fnhead *)NativeAligned4FromLAddr(defcell68k->defpointer);

  if ((UNSIGNED)(CurrentStackPTR + tmp_fn->stkmin + STK_SAFE) >= (UNSIGNED)EndSTKP) {
    LispPTR test;
    test = *((LispPTR *)CurrentStackPTR);
    DOSTACKOVERFLOW(argnum, bytenum - 1);
    S_CHECK(test == *((LispPTR *)CurrentStackPTR), "stack overflow in ccfuncall");
  }
  FuncObj = tmp_fn;

  if (FuncObj->na >= 0) {
    /* This Function is Spread Type */
    /* Arguments on Stack Adjustment  */
    rest = argnum - FuncObj->na;

    while (rest < 0) {
      PushStack(NIL_PTR);
      rest++;
    }
    CurrentStackPTR -= (rest << 1);
  } /* if end */

  /* Set up BF */
  CurrentStackPTR += 2;
  GETWORD(CurrentStackPTR) = BF_MARK;
  GETWORD(CurrentStackPTR + 1) = CURRENTFX->nextblock;
  CurrentStackPTR += 2;

  /* Set up FX */
  GETWORD(CurrentStackPTR) = FX_MARK;

  /* Now SET new FX */
  ((struct frameex1 *)CurrentStackPTR)->alink = LAddrFromNative(PVar);
  PVar = (DLword *)CurrentStackPTR + FRAMESIZE;
#ifdef BIGVM
  ((struct frameex1 *)CurrentStackPTR)->fnheader = (defcell68k->defpointer);
#else
  ((struct frameex1 *)CurrentStackPTR)->lofnheader = (defcell68k->defpointer) & 0x0ffff;
  ((struct frameex1 *)CurrentStackPTR)->hi2fnheader = ((defcell68k->defpointer) & SEGMASK) >> 16;
#endif /* BIGVM */
  CurrentStackPTR = PVar;

  /* Set up PVar area */
  pv_num = FuncObj->pv + 1; /* Changed Apr.27 */

  while (pv_num > 0) {
    *((LispPTR *)CurrentStackPTR) = 0x0ffff0000;
    CurrentStackPTR += DLWORDSPER_CELL;
    *((LispPTR *)CurrentStackPTR) = 0x0ffff0000;
    CurrentStackPTR += DLWORDSPER_CELL;
    pv_num--;
  }

  /* Set PC points New Function's first OPCODE */
  PC = (ByteCode *)FuncObj + FuncObj->startpc;
  /* It assume that ccfuncall is called  for PUNTing from SUBRCALL */
  PC -= 3; /* Ajust PC */

}